

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

uint GetAllocaAddress(InstructionVMEvalContext *ctx,VariableData *container)

{
  SmallArray<VariableData_*,_4U> *pSVar1;
  uint uVar2;
  VariableData *pVVar3;
  VmFunction *pVVar4;
  uint uVar5;
  long lVar6;
  
  uVar2 = (ctx->stackFrames).count;
  if (uVar2 == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x172,
                  "T &SmallArray<InstructionVMEvalContext::StackFrame *, 32>::back() [T = InstructionVMEvalContext::StackFrame *, N = 32]"
                 );
  }
  pVVar4 = (ctx->stackFrames).data[uVar2 - 1]->owner;
  uVar2 = (pVVar4->allocas).count;
  if (uVar2 != 0) {
    pSVar1 = &pVVar4->allocas;
    uVar5 = 8;
    lVar6 = 0;
    do {
      pVVar3 = pSVar1->data[lVar6];
      if (pVVar3 == container) {
        pVVar4 = (VmFunction *)(ulong)uVar5;
      }
      else {
        uVar5 = uVar5 + (int)pVVar3->type->size;
      }
      if (pVVar3 == container) {
        return (uint)pVVar4;
      }
      lVar6 = lVar6 + 1;
    } while (uVar2 != (uint)lVar6);
  }
  return 0;
}

Assistant:

unsigned GetAllocaAddress(InstructionVMEvalContext &ctx, VariableData *container)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	unsigned offset = 8;

	for(unsigned i = 0; i < frame->owner->allocas.size(); i++)
	{
		VariableData *data = frame->owner->allocas[i];

		if(container == data)
			return offset;

		offset += unsigned(data->type->size);
	}

	return 0;
}